

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

bool __thiscall cashew::JSPrinter::isNothing(JSPrinter *this,Ref node)

{
  char cVar1;
  Ref *this_00;
  undefined8 *puVar2;
  size_t sVar3;
  bool bVar4;
  Value *local_18;
  Ref node_local;
  
  if ((node.inst)->type == Array) {
    bVar4 = false;
    local_18 = node.inst;
    this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_18);
    cVar1 = cashew::Ref::operator==(this_00,(IString *)&TOPLEVEL);
    if (cVar1 != '\0') {
      puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_18);
      sVar3 = Value::size((Value *)*puVar2);
      bVar4 = sVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool isNothing(Ref node) {
    return node->isArray() && node[0] == TOPLEVEL && node[1]->size() == 0;
  }